

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O2

gcstring * GenApi_3_4::TrimSpace(gcstring *s,istream *is)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  locale alStack_48 [8];
  istream *local_40;
  istream *local_38;
  
  uVar3 = (**(code **)(*(long *)s + 0x80))();
  local_40 = is + 0xd0;
  local_38 = is;
  for (uVar5 = 0; uVar6 = uVar3, uVar3 != uVar5; uVar5 = uVar5 + 1) {
    pcVar4 = GenICam_3_4::gcstring::operator_cast_to_char_(s);
    cVar1 = pcVar4[uVar5];
    std::locale::locale(alStack_48,(locale *)(local_40 + *(long *)(*(long *)local_38 + -0x18)));
    bVar2 = std::isspace<char>(cVar1,alStack_48);
    std::locale::~locale(alStack_48);
    uVar6 = uVar5;
    if (!bVar2) break;
  }
  do {
    uVar5 = uVar3;
    if (uVar5 - 1 <= uVar6) break;
    pcVar4 = GenICam_3_4::gcstring::operator_cast_to_char_(s);
    cVar1 = pcVar4[uVar5 - 1];
    std::locale::locale(alStack_48,(locale *)(local_40 + *(long *)(*(long *)local_38 + -0x18)));
    bVar2 = std::isspace<char>(cVar1,alStack_48);
    std::locale::~locale(alStack_48);
    uVar3 = uVar5 - 1;
  } while (bVar2);
  uVar3 = (**(code **)(*(long *)s + 0x80))(s);
  if (uVar5 - 1 < uVar3) {
    (**(code **)(*(long *)s + 0xa0))(s,uVar5,0xffffffffffffffff);
  }
  (**(code **)(*(long *)s + 0xa0))(s,0,uVar6);
  return s;
}

Assistant:

inline GENICAM_NAMESPACE::gcstring& TrimSpace( GENICAM_NAMESPACE::gcstring& s, std::istream& is )
    {
        size_t iend =s.length();
        size_t ibegin = 0;
        for (; ibegin < iend && std::isspace( s[ibegin], is.getloc() ); ++ibegin);
        for (--iend; ibegin < iend; --iend)
        {
            if (!std::isspace( s[iend], is.getloc() ))
                break;
        }
        if (iend < s.length())
        {
            s.erase(iend + 1);
        }
        s.erase( 0, ibegin );

        return s;
    }